

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteDoubleArray
               (double *a,int n,CodedOutputStream *output)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  WriteArray<double>((double *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),(CodedOutputStream *)0x420183);
  return;
}

Assistant:

void WireFormatLite::WriteDoubleArray(const double* a, int n,
                                      io::CodedOutputStream* output) {
  WriteArray<double>(a, n, output);
}